

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

void djgc_ticks(djg_clock *clock,double *tcpu,double *tgpu)

{
  long lVar1;
  undefined1 auVar2 [16];
  GLuint64 local_30;
  GLuint64 stop;
  GLuint64 start;
  double *tgpu_local;
  double *tcpu_local;
  djg_clock *clock_local;
  
  start = (GLuint64)tgpu;
  tgpu_local = tcpu;
  tcpu_local = &clock->cpu_ticks;
  if (clock == (djg_clock *)0x0) {
    __assert_fail("clock",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x135,"void djgc_ticks(djg_clock *, double *, double *)");
  }
  if ((clock->is_gpu_ticking == 0) &&
     ((*glad_glGetQueryObjectiv)(clock->queries[1],0x8867,&clock->is_gpu_ready),
     *(int *)(tcpu_local + 5) != 0)) {
    (*glad_glGetQueryObjectui64v)(*(GLuint *)((long)tcpu_local + 0x1c),0x8866,&local_30);
    (*glad_glGetQueryObjectui64v)(*(GLuint *)(tcpu_local + 3),0x8866,&stop);
    lVar1 = local_30 - stop;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    tcpu_local[1] =
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000000000.0;
  }
  if (tgpu_local != (double *)0x0) {
    *tgpu_local = *tcpu_local;
  }
  if (start != 0) {
    *(double *)start = tcpu_local[1];
  }
  return;
}

Assistant:

DJGDEF void djgc_ticks(djg_clock *clock, double *tcpu, double *tgpu)
{
    DJG_ASSERT(clock);
    if (!clock->is_gpu_ticking) {
        glGetQueryObjectiv(clock->queries[DJGC__QUERY_STOP],
                           GL_QUERY_RESULT_AVAILABLE,
                           &clock->is_gpu_ready);
        if (clock->is_gpu_ready) {
            GLuint64 start, stop;

            glGetQueryObjectui64v(clock->queries[DJGC__QUERY_STOP],
                                  GL_QUERY_RESULT,
                                  &stop);
            glGetQueryObjectui64v(clock->queries[DJGC__QUERY_START],
                                  GL_QUERY_RESULT,
                                  &start);
            clock->gpu_ticks = (stop - start) / 1e9;
        }
    }
    if (tcpu) *tcpu = clock->cpu_ticks;
    if (tgpu) *tgpu = clock->gpu_ticks;
}